

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

void freeblock(Memcontrol *mc,Header_conflict *block)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  if (block != (Header_conflict *)0x0) {
    sVar1 = (block->d).size;
    lVar3 = 0;
    while (lVar3 != 0x10) {
      lVar2 = lVar3 + sVar1 + 0x10;
      lVar3 = lVar3 + 1;
      if (*(char *)((long)block + lVar2) != 'U') {
        __assert_fail("*(((char *)((block + 1))) + size + i) == 0x55",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x76,"void freeblock(Memcontrol *, Header *)");
      }
    }
    mc->objcount[(block->d).type] = mc->objcount[(block->d).type] - 1;
    free(block);
    mc->numblocks = mc->numblocks - 1;
    mc->total = mc->total - sVar1;
  }
  return;
}

Assistant:

static void freeblock (Memcontrol *mc, Header *block) {
  if (block) {
    size_t size = block->d.size;
    int i;
    for (i = 0; i < MARKSIZE; i++)  /* check marks after block */
      lua_assert(*(cast_charp(block + 1) + size + i) == MARK);
    mc->objcount[block->d.type]--;
    fillmem(block, sizeof(Header) + size + MARKSIZE);  /* erase block */
    free(block);  /* actually free block */
    mc->numblocks--;  /* update counts */
    mc->total -= size;
  }
}